

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O0

void cf2_glyphpath_hintPoint
               (CF2_GlyphPath glyphpath,CF2_HintMap hintmap,FT_Vector *ppt,CF2_F16Dot16 x,
               CF2_F16Dot16 y)

{
  FT_Int32 FVar1;
  FT_Int32 FVar2;
  CF2_F16Dot16 b;
  FT_Int32 FVar3;
  FT_Int32 FVar4;
  FT_Vector pt;
  CF2_F16Dot16 y_local;
  CF2_F16Dot16 x_local;
  FT_Vector *ppt_local;
  CF2_HintMap hintmap_local;
  CF2_GlyphPath glyphpath_local;
  
  FVar1 = FT_MulFix_x86_64(glyphpath->scaleX,x);
  FVar2 = FT_MulFix_x86_64(glyphpath->scaleC,y);
  b = cf2_hintmap_map(hintmap,y);
  FVar3 = FT_MulFix_x86_64((glyphpath->font->outerTransform).a,FVar1 + FVar2);
  FVar4 = FT_MulFix_x86_64((glyphpath->font->outerTransform).c,b);
  ppt->x = (long)(FVar3 + FVar4 + (int)(glyphpath->fractionalTranslation).x);
  FVar1 = FT_MulFix_x86_64((glyphpath->font->outerTransform).b,FVar1 + FVar2);
  FVar2 = FT_MulFix_x86_64((glyphpath->font->outerTransform).d,b);
  ppt->y = (long)(FVar1 + FVar2 + (int)(glyphpath->fractionalTranslation).y);
  return;
}

Assistant:

static void
  cf2_glyphpath_hintPoint( CF2_GlyphPath  glyphpath,
                           CF2_HintMap    hintmap,
                           FT_Vector*     ppt,
                           CF2_Fixed      x,
                           CF2_Fixed      y )
  {
    FT_Vector  pt;   /* hinted point in upright DS */


    pt.x = ADD_INT32( FT_MulFix( glyphpath->scaleX, x ),
                      FT_MulFix( glyphpath->scaleC, y ) );
    pt.y = cf2_hintmap_map( hintmap, y );

    ppt->x = ADD_INT32(
               FT_MulFix( glyphpath->font->outerTransform.a, pt.x ),
               ADD_INT32(
                 FT_MulFix( glyphpath->font->outerTransform.c, pt.y ),
                 glyphpath->fractionalTranslation.x ) );
    ppt->y = ADD_INT32(
               FT_MulFix( glyphpath->font->outerTransform.b, pt.x ),
               ADD_INT32(
                 FT_MulFix( glyphpath->font->outerTransform.d, pt.y ),
                 glyphpath->fractionalTranslation.y ) );
  }